

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.h
# Opt level: O0

void __thiscall GdlGlyphClassDefn::GdlGlyphClassDefn(GdlGlyphClassDefn *this)

{
  GdlGlyphClassMember *in_RDI;
  
  GdlGlyphClassMember::GdlGlyphClassMember(in_RDI);
  (in_RDI->super_GdlDefn)._vptr_GdlDefn = (_func_int **)&PTR__GdlGlyphClassDefn_0036b6f8;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::vector
            ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)0x14ce42);
  std::vector<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>::vector
            ((vector<GrpLineAndFile,_std::allocator<GrpLineAndFile>_> *)0x14ce50);
  std::vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>::vector
            ((vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *)0x14ce61);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x14ce72);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x14ce83);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14ce94);
  in_RDI[4].super_GdlDefn.super_GdlObject.m_lnf.field_0x18 = 0;
  in_RDI[4].super_GdlDefn.super_GdlObject.m_lnf.field_0x19 = 0;
  *(undefined4 *)&in_RDI[4].super_GdlDefn.super_GdlObject.m_lnf.field_0x1c = 0xffffffff;
  *(undefined4 *)&in_RDI[4].super_GdlDefn.super_GdlObject.m_lnf.field_0x20 = 0xffffffff;
  in_RDI[3].super_GdlDefn.super_GdlObject.m_lnf.m_staFile = (string)0x0;
  return;
}

Assistant:

GdlGlyphClassDefn()
		: GdlGlyphClassMember()
	{
		
		m_fReplcmtIn = false;
		m_fReplcmtOut = false;
		m_nReplcmtInID = -1;
		m_nReplcmtOutID = -1;
		m_fHasFlatList = false;
	}